

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O2

peer_request __thiscall
libtorrent::file_storage::map_file
          (file_storage *this,file_index_t file_index,int64_t file_offset,int size)

{
  pointer pfVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  peer_request pVar7;
  
  pfVar1 = (this->m_files).
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (file_index.m_val <
      (int)(((long)(this->m_files).
                   super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                   .
                   super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1) / 0x28)) {
    lVar6 = (*(ulong *)(pfVar1 + file_index.m_val) & 0xffffffffffff) + file_offset;
    lVar2 = this->m_total_size;
    if (lVar6 < lVar2) {
      uVar3 = (uint)(lVar6 / (long)this->m_piece_length);
      lVar4 = lVar6 % (long)this->m_piece_length;
      if (lVar2 < size + lVar6) {
        size = (int)lVar2 - (int)lVar6;
      }
    }
    else {
      uVar3 = this->m_num_pieces;
      size = 0;
      lVar4 = 0;
    }
    uVar5 = lVar4 << 0x20;
  }
  else {
    uVar3 = this->m_num_pieces;
    size = 0;
    uVar5 = 0;
  }
  pVar7._0_8_ = uVar3 | uVar5;
  pVar7.length = size;
  return pVar7;
}

Assistant:

peer_request file_storage::map_file(file_index_t const file_index
		, std::int64_t const file_offset, int const size) const
	{
		TORRENT_ASSERT_PRECOND(file_index < end_file());
		TORRENT_ASSERT(m_num_pieces >= 0);

		peer_request ret{};
		if (file_index >= end_file())
		{
			ret.piece = end_piece();
			ret.start = 0;
			ret.length = 0;
			return ret;
		}

		std::int64_t const offset = file_offset + this->file_offset(file_index);

		if (offset >= total_size())
		{
			ret.piece = end_piece();
			ret.start = 0;
			ret.length = 0;
		}
		else
		{
			ret.piece = piece_index_t(int(offset / piece_length()));
			ret.start = int(offset % piece_length());
			ret.length = size;
			if (offset + size > total_size())
				ret.length = int(total_size() - offset);
		}
		return ret;
	}